

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O3

int __thiscall Layer_c_api::load_model(Layer_c_api *this,ModelBin *mb)

{
  int iVar1;
  __ncnn_modelbin_t mb0;
  __ncnn_modelbin_t local_20;
  
  local_20.load_1d = __ncnn_modelbin_load_1d;
  local_20.load_2d = __ncnn_modelbin_load_2d;
  local_20.load_3d = __ncnn_modelbin_load_3d;
  local_20.pthis = mb;
  iVar1 = (*this->layer->load_model)(this->layer,&local_20);
  return iVar1;
}

Assistant:

virtual int load_model(const ModelBin& mb)
    {
        struct __ncnn_modelbin_t mb0;
        mb0.pthis = (void*)&mb;
        mb0.load_1d = __ncnn_modelbin_load_1d;
        mb0.load_2d = __ncnn_modelbin_load_2d;
        mb0.load_3d = __ncnn_modelbin_load_3d;
        return layer->load_model(layer, &mb0);
    }